

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O3

TestStatus *
vkt::wsi::anon_unknown_0::destroyNullHandleSwapchainTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  PFN_vkAllocationFunction *pp_Var1;
  undefined8 uVar2;
  VkAllocationCallbacks *allocator;
  AllocationCallbackRecorder recordingAllocator;
  InstanceHelper instHelper;
  long *local_798;
  long local_790;
  long local_788 [2];
  deUint64 local_778;
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_770;
  VkDevice local_768;
  VkAllocationCallbacks *pVStack_760;
  AllocationCallbackRecorder local_750;
  NativeObjects local_6f0;
  InstanceHelper local_6d0;
  undefined1 local_518 [16];
  VkDevice local_508;
  VkAllocationCallbacks *pVStack_500;
  VkAllocationCallbacks *local_4f8;
  DeviceDriver local_4f0;
  
  InstanceHelper::InstanceHelper(&local_6d0,context,wsiType,(VkAllocationCallbacks *)0x0);
  local_518._0_8_ = (Vector<unsigned_int,_2> *)0x0;
  NativeObjects::NativeObjects
            (&local_6f0,(Context *)context->m_testCtx->m_platform,&local_6d0.supportedExtensions,
             wsiType,(Maybe<tcu::Vector<unsigned_int,_2>_> *)local_518);
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)local_518,
             &local_6d0.vki.super_InstanceInterface,
             local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             local_6f0.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             local_6f0.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr,
             (VkAllocationCallbacks *)0x0);
  uVar2 = local_518._0_8_;
  local_768 = local_508;
  pVStack_760 = pVStack_500;
  local_778 = local_518._0_8_;
  aStack_770 = (anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2)local_518._8_8_;
  DeviceHelper::DeviceHelper
            ((DeviceHelper *)local_518,(Context *)context->m_testCtx->m_cmdLine,
             &local_6d0.vki.super_InstanceInterface,
             local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
             (VkSurfaceKHR)local_518._0_8_,(VkAllocationCallbacks *)0x0);
  ::vk::DeviceDriver::destroySwapchainKHR
            (&local_4f0,local_508,(VkSwapchainKHR)0x0,(VkAllocationCallbacks *)0x0);
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_750,allocator,1);
  ::vk::DeviceDriver::destroySwapchainKHR
            (&local_4f0,local_508,(VkSwapchainKHR)0x0,
             &local_750.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks);
  if (local_750.m_records.m_numElements == 0) {
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_750);
    pp_Var1 = &local_750.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnAllocation;
    local_750.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
         (_func_int **)pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_750,"Destroying a VK_NULL_HANDLE surface has no effect","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_750.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks,
               (undefined1 *)
               ((long)local_750.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.
                      pUserData +
               (long)local_750.super_ChainedAllocator.super_AllocationCallbacks.
                     _vptr_AllocationCallbacks));
    if ((PFN_vkAllocationFunction *)
        local_750.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks !=
        pp_Var1) {
      operator_delete(local_750.super_ChainedAllocator.super_AllocationCallbacks.
                      _vptr_AllocationCallbacks,
                      (ulong)(local_750.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks
                              .pfnAllocation + 1));
    }
  }
  else {
    local_798 = local_788;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_798,"Implementation allocated/freed the memory","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_798,
               local_790 + (long)local_798);
    if (local_798 != local_788) {
      operator_delete(local_798,local_788[0] + 1);
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_750);
  }
  ::vk::DeviceDriver::~DeviceDriver(&local_4f0);
  if (local_508 != (VkDevice)0x0) {
    (*(code *)pVStack_500)(local_508,local_4f8);
  }
  if (uVar2 != 0) {
    (**(code **)(*(long *)aStack_770 + 0x68))(aStack_770.m_align,local_768,uVar2,pVStack_760);
  }
  (*(local_6f0.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data
    .ptr)->_vptr_Window[1])
            (local_6f0.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr);
  (*(local_6f0.display.super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
     m_data.ptr)->_vptr_Display[1])
            (local_6f0.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr);
  ::vk::InstanceDriver::~InstanceDriver(&local_6d0.vki);
  if (local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0) {
    (*local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
  }
  local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object = (VkInstance_s *)0x0;
  local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance =
       (DestroyInstanceFunc)0x0;
  local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_6d0.supportedExtensions.
      super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d0.supportedExtensions.
                    super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d0.supportedExtensions.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d0.supportedExtensions.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus destroyNullHandleSwapchainTest (Context& context, Type wsiType)
{
	const InstanceHelper		instHelper	(context, wsiType);
	const NativeObjects			native		(context, instHelper.supportedExtensions, wsiType);
	const Unique<VkSurfaceKHR>	surface		(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const DeviceHelper			devHelper	(context, instHelper.vki, *instHelper.instance, *surface);
	const VkSwapchainKHR		nullHandle	= DE_NULL;

	// Default allocator
	devHelper.vkd.destroySwapchainKHR(*devHelper.device, nullHandle, DE_NULL);

	// Custom allocator
	{
		AllocationCallbackRecorder	recordingAllocator	(getSystemAllocator(), 1u);

		devHelper.vkd.destroySwapchainKHR(*devHelper.device, nullHandle, recordingAllocator.getCallbacks());

		if (recordingAllocator.getNumRecords() != 0u)
			return tcu::TestStatus::fail("Implementation allocated/freed the memory");
	}

	return tcu::TestStatus::pass("Destroying a VK_NULL_HANDLE surface has no effect");
}